

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O3

void __thiscall
cs::statement_try::statement_try
          (statement_try *this,string *name,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *tbody,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *cbody,context_t *c,
          token_base *ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  
  peVar4 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var5;
  (this->super_statement_base).line_num = ptr->line_num;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_try_0032b5c0;
  paVar1 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mName).field_2 + 8) = uVar6;
  }
  else {
    (this->mName)._M_dataplus._M_p = pcVar3;
    (this->mName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mName)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&(this->mTryBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,
             &tbody->super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
  ;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&(this->mCatchBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,
             &cbody->super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
  ;
  return;
}

Assistant:

statement_try(std::string name, std::deque<statement_base *> tbody,
		              std::deque<statement_base *> cbody, context_t c, token_base *ptr) : statement_base(
			                  std::move(c), ptr),
			mName(std::move(name)),
			mTryBody(std::move(tbody)),
			mCatchBody(
			    std::move(cbody)) {}